

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateImportTargetCode
          (cmExportBuildAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target,
          TargetType param_3)

{
  ostream *poVar1;
  string targetName;
  string path;
  string noConfig;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  undefined1 local_50 [48];
  
  local_50._8_8_ =
       (this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace._M_dataplus.
       _M_p;
  local_50._0_8_ =
       (this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace.
       _M_string_length;
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_c0,target);
  local_80.View_._M_len = local_c0._M_string_length;
  local_80.View_._M_str = local_c0._M_dataplus._M_p;
  cmStrCat<>(&local_a0,(cmAlphaNum *)local_50,&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar1 = std::operator<<(os,(string *)&local_a0);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := ");
  local_50._0_8_ = local_50 + 0x10;
  local_50._8_8_ = (char *)0x0;
  local_50[0x10] = '\0';
  cmGeneratorTarget::GetFullPath(&local_c0,target,(string *)local_50,RuntimeBinaryArtifact,false);
  cmSystemTools::ConvertToOutputPath((string *)&local_80,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  poVar1 = std::operator<<(os,(string *)&local_80);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType /*targetType*/)
{
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := ";
  std::string const noConfig; // FIXME: What config to use here?
  std::string path =
    cmSystemTools::ConvertToOutputPath(target->GetFullPath(noConfig));
  os << path << "\n";
}